

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  FILE *__stream;
  ostream *poVar4;
  FilePath output_file;
  FilePath output_dir;
  stringstream stream;
  FilePath local_218;
  string local_1f8;
  FilePath local_1d8;
  GTestLog local_1b8 [4];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  paVar1 = &local_218.pathname_.field_2;
  pcVar2 = (this->output_file_)._M_dataplus._M_p;
  local_218.pathname_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar2,pcVar2 + (this->output_file_)._M_string_length);
  FilePath::Normalize(&local_218);
  FilePath::RemoveFileName(&local_1d8,&local_218);
  bVar3 = FilePath::CreateDirectoriesRecursively(&local_1d8);
  if (bVar3) {
    __stream = fopen((this->output_file_)._M_dataplus._M_p,"w");
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (__stream == (FILE *)0x0) {
    GTestLog::GTestLog(local_1b8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/src/gtest.cc"
                       ,0xdaa);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->output_file_)._M_dataplus._M_p,
                        (this->output_file_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    GTestLog::~GTestLog(local_1b8);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  PrintXmlUnitTest(local_1a8,unit_test);
  StringStreamToString(&local_1f8,(stringstream *)local_1b8);
  fputs(local_1f8._M_dataplus._M_p,__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.pathname_._M_dataplus._M_p != &local_1d8.pathname_.field_2) {
    operator_delete(local_1d8.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.pathname_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.

    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file_ << "\"";
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}